

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Beamforming * webrtc::Config::default_value<webrtc::Beamforming>(void)

{
  int iVar1;
  
  if (default_value<webrtc::Beamforming>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::Beamforming>()::def);
    if (iVar1 != 0) {
      default_value<webrtc::Beamforming>::def = (Beamforming *)operator_new(0x30);
      default_value<webrtc::Beamforming>::def->enabled = false;
      (default_value<webrtc::Beamforming>::def->array_geometry).
      super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (default_value<webrtc::Beamforming>::def->array_geometry).
      super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (default_value<webrtc::Beamforming>::def->array_geometry).
      super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (default_value<webrtc::Beamforming>::def->target_direction).s[0] = 1.5707964;
      (default_value<webrtc::Beamforming>::def->target_direction).s[1] = 0.0;
      (default_value<webrtc::Beamforming>::def->target_direction).s[2] = 1.0;
      __cxa_guard_release(&default_value<webrtc::Beamforming>()::def);
    }
  }
  return default_value<webrtc::Beamforming>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }